

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
sequence<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>>
          (sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *xpr)

{
  counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  uint uVar2;
  dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar3;
  long lVar4;
  
  *this = (sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x1;
  pdVar3 = xpr->px;
  uVar2 = (pdVar3->
          super_simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>
          ).min_;
  lVar4 = 0x3ffffffe;
  if (uVar2 == (pdVar3->
               super_simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>
               ).max_) {
    lVar4 = (ulong)uVar2 *
            (pdVar3->
            super_simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>
            ).width_;
  }
  *(long *)(this + 8) = lVar4;
  *(undefined4 *)(this + 0x10) = 2;
  pdVar3 = xpr->px;
  if (pdVar3 == (dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    *(undefined8 *)(this + 0x18) = 0;
  }
  else {
    LOCK();
    pcVar1 = &(pdVar3->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
    UNLOCK();
    *(dynamic_xpression<boost::xpressive::detail::simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>,_mpl_::bool_<true>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(this + 0x18) = pdVar3;
    LOCK();
    pcVar1 = &(pdVar3->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
    UNLOCK();
    LOCK();
    pcVar1 = &(pdVar3->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
    UNLOCK();
    if ((pcVar1->count_).value_ == 0) {
      (*(pdVar3->
        super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._vptr_matchable[1])();
    }
  }
  *(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)(this + 0x20) = &xpr->px->next_;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  return;
}

Assistant:

sequence(intrusive_ptr<dynamic_xpression<Matcher, BidiIter> > const &xpr)
      : pure_(Matcher::pure)
      , width_(xpr->Matcher::get_width())
      , quant_(static_cast<quant_enum>(Matcher::quant))
      , head_(xpr)
      , tail_(&xpr->next_)
      , alt_end_xpr_()
      , alternates_(0)
    {
    }